

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NetworkUpdateParameters::SharedDtor(NetworkUpdateParameters *this)

{
  if (this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    if (this->optimizer_ != (Optimizer *)0x0) {
      (*(this->optimizer_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->epochs_ != (Int64Parameter *)0x0) {
      (*(this->epochs_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->shuffle_ != (BoolParameter *)0x0) {
      (*(this->shuffle_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->seed_ != (Int64Parameter *)0x0) {
      (*(this->seed_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void NetworkUpdateParameters::SharedDtor() {
  if (this != internal_default_instance()) {
    delete optimizer_;
  }
  if (this != internal_default_instance()) {
    delete epochs_;
  }
  if (this != internal_default_instance()) {
    delete shuffle_;
  }
  if (this != internal_default_instance()) {
    delete seed_;
  }
}